

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_type_safe::basic_optional<type_safe::direct_optional_storage<int>_>_&,_const_type_safe::nullopt_t_&>
* __thiscall
Catch::ExprLhs<type_safe::basic_optional<type_safe::direct_optional_storage<int>>const&>::operator>=
          (BinaryExpr<const_type_safe::basic_optional<type_safe::direct_optional_storage<int>_>_&,_const_type_safe::nullopt_t_&>
           *__return_storage_ptr__,
          ExprLhs<type_safe::basic_optional<type_safe::direct_optional_storage<int>>const&> *this,
          nullopt_t *rhs)

{
  basic_optional<type_safe::direct_optional_storage<int>_> *lhs;
  bool comparisonResult;
  StringRef local_38;
  nullopt_t *local_20;
  nullopt_t *rhs_local;
  ExprLhs<const_type_safe::basic_optional<type_safe::direct_optional_storage<int>_>_&> *this_local;
  
  local_20 = rhs;
  rhs_local = (nullopt_t *)this;
  this_local = (ExprLhs<const_type_safe::basic_optional<type_safe::direct_optional_storage<int>_>_&>
                *)__return_storage_ptr__;
  comparisonResult = type_safe::operator>=(*(undefined8 *)this);
  lhs = *(basic_optional<type_safe::direct_optional_storage<int>_> **)this;
  StringRef::StringRef(&local_38,">=");
  BinaryExpr<const_type_safe::basic_optional<type_safe::direct_optional_storage<int>_>_&,_const_type_safe::nullopt_t_&>
  ::BinaryExpr(__return_storage_ptr__,comparisonResult,lhs,local_38,local_20);
  return __return_storage_ptr__;
}

Assistant:

auto operator >= ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { static_cast<bool>(m_lhs >= rhs), m_lhs, ">=", rhs };
        }